

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void print_rel_map(wchar_t c,uint8_t a,wchar_t y,wchar_t x)

{
  int iVar1;
  int iVar2;
  int local_5c;
  int local_38;
  int local_34;
  wchar_t map_height;
  wchar_t map_width;
  term_conflict *t;
  wchar_t local_20;
  wchar_t j;
  wchar_t kx;
  wchar_t ky;
  wchar_t x_local;
  wchar_t y_local;
  uint8_t a_local;
  wchar_t c_local;
  
  t._4_4_ = 0;
  kx = x;
  ky = y;
  x_local._3_1_ = a;
  y_local = c;
  do {
    if (7 < t._4_4_) {
      return;
    }
    _map_height = (term_conflict *)angband_term[t._4_4_];
    if ((_map_height != (term_conflict *)0x0) && ((window_flag[t._4_4_] & 0xa0) != 0)) {
      if ((window_flag[t._4_4_] & 0x20) == 0) {
        j = ky - _map_height->offset_y;
        if (((1 < tile_height) && (j = (uint)tile_height * j, _map_height->hgt <= j + L'\x01')) ||
           ((local_20 = kx - _map_height->offset_x, 1 < tile_width &&
            (local_20 = (uint)tile_width * local_20, _map_height->wid <= local_20 + L'\x01'))))
        goto LAB_00258b92;
      }
      else {
        get_minimap_dimensions
                  (_map_height,(chunk *)cave,(uint)tile_width,(uint)tile_height,&local_34,&local_38)
        ;
        iVar1 = (kx * local_34) / cave->width;
        iVar2 = (ky * local_38) / cave->height;
        if (1 < tile_width) {
          iVar1 = iVar1 - iVar1 % (int)(uint)tile_width;
        }
        local_20 = iVar1 + L'\x01';
        if (1 < tile_height) {
          iVar2 = iVar2 - iVar2 % (int)(uint)tile_height;
        }
        j = iVar2 + L'\x01';
      }
      if ((((L'\xffffffff' < j) && (j < _map_height->hgt)) && (L'\xffffffff' < local_20)) &&
         ((local_20 < _map_height->wid &&
          ((Term_queue_char((term *)_map_height,local_20,j,(uint)x_local._3_1_,y_local,L'\0',L'\0'),
           1 < tile_width || (1 < tile_height)))))) {
        if ((window_flag[t._4_4_] & 0x80) == 0) {
          local_5c = row_bottom_map[Term->sidebar_mode];
        }
        else {
          local_5c = 0;
        }
        Term_big_queue_char((term *)_map_height,local_20,j,_map_height->hgt - local_5c,
                            (uint)x_local._3_1_,y_local,L'\0',L'\0');
      }
    }
LAB_00258b92:
    t._4_4_ = t._4_4_ + 1;
  } while( true );
}

Assistant:

static void print_rel_map(wchar_t c, uint8_t a, int y, int x)
{
	int ky, kx;

	int j;

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++) {
		term *t = angband_term[j];

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if (!(window_flag[j] & (PW_MAPS))) continue;

		if (window_flag[j] & PW_MAP) {
			/* Be consistent with display_map(). */
			int map_width, map_height;

			get_minimap_dimensions(t, cave, tile_width,
				tile_height, &map_width, &map_height);

			kx = (x * map_width) / cave->width;
			ky = (y * map_height) / cave->height;
			if (tile_width > 1) {
				kx = kx - (kx % tile_width) + 1;
			} else {
				++kx;
			}
			if (tile_height > 1) {
				ky = ky - (ky % tile_height) + 1;
			} else {
				++ky;
			}
		} else {
			/* Location relative to panel */
			ky = y - t->offset_y;

			if (tile_height > 1) {
				ky = tile_height * ky;
				if (ky + 1 >= t->hgt) continue;
			}

			kx = x - t->offset_x;

			if (tile_width > 1) {
				kx = tile_width * kx;
				if (kx + 1 >= t->wid) continue;
			}
		}

		/* Verify location */
		if ((ky < 0) || (ky >= t->hgt)) continue;
		if ((kx < 0) || (kx >= t->wid)) continue;

		/* Hack -- Queue it */
		Term_queue_char(t, kx, ky, a, c, 0, 0);

		if ((tile_width > 1) || (tile_height > 1))
			/*
			 * The overhead view can make use of the last row in
			 * the terminal.  Others leave it be.
			 */
			Term_big_queue_char(t, kx, ky, t->hgt -
				((window_flag[j] & PW_OVERHEAD) ? 0 : ROW_BOTTOM_MAP),
				a, c, 0, 0);
	}
}